

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcarith.c
# Opt level: O3

void jinit_arith_encoder(j_compress_ptr cinfo)

{
  jpeg_entropy_encoder *pjVar1;
  
  pjVar1 = (jpeg_entropy_encoder *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x170);
  cinfo->entropy = pjVar1;
  pjVar1->start_pass = start_pass;
  pjVar1->finish_pass = finish_pass;
  memset(&pjVar1[4].encode_mcu,0,0x100);
  *(undefined1 *)&pjVar1[0xf].start_pass = 0x71;
  return;
}

Assistant:

GLOBAL(void)
jinit_arith_encoder(j_compress_ptr cinfo)
{
  arith_entropy_ptr entropy;
  int i;

  entropy = (arith_entropy_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(arith_entropy_encoder));
  cinfo->entropy = (struct jpeg_entropy_encoder *)entropy;
  entropy->pub.start_pass = start_pass;
  entropy->pub.finish_pass = finish_pass;

  /* Mark tables unallocated */
  for (i = 0; i < NUM_ARITH_TBLS; i++) {
    entropy->dc_stats[i] = NULL;
    entropy->ac_stats[i] = NULL;
  }

  /* Initialize index for fixed probability estimation */
  entropy->fixed_bin[0] = 113;
}